

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
          (DListBase<Memory::CustomHeap::Page,_RealCount> *this,Page *element,
          DListBase<Memory::CustomHeap::Page,_RealCount> *list)

{
  char *pcVar1;
  DListNodeBase<Memory::CustomHeap::Page> *pDVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  char **node;
  
  node = &element[-1].address;
  bVar4 = HasNode(this,(NodeBase *)node);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x1a9,"(HasNode(node))","HasNode(node)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pcVar1 = *node;
  **(long **)&element[-1].currentBucket = (long)pcVar1;
  *(undefined8 *)(pcVar1 + 8) = *(undefined8 *)&element[-1].currentBucket;
  pDVar2 = (list->super_DListNodeBase<Memory::CustomHeap::Page>).next.base;
  *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].currentBucket = pDVar2->prev;
  *node = (char *)pDVar2;
  *(char ***)pDVar2->prev = node;
  (pDVar2->prev).base = (DListNodeBase<Memory::CustomHeap::Page> *)node;
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  (list->super_RealCount).count = (list->super_RealCount).count + 1;
  return;
}

Assistant:

void MoveElementTo(TData * element, DListBase * list)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        DListBase::InsertNodeBefore(list->Next(), node);
        this->DecrementCount();
        list->IncrementCount();
    }